

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context_wrapper.cpp
# Opt level: O2

shared_ptr<duckdb::ClientContext,_true> __thiscall
duckdb::ClientContextWrapper::GetContext(ClientContextWrapper *this)

{
  ConnectionException *this_00;
  shared_ptr<duckdb::ClientContext,_true> *actual_context;
  shared_ptr<duckdb::ClientContext,_true> sVar1;
  allocator local_41;
  string local_40;
  
  sVar1 = weak_ptr<duckdb::ClientContext,_true>::lock((weak_ptr<duckdb::ClientContext,_true> *)this)
  ;
  if (this->_vptr_ClientContextWrapper != (_func_int **)0x0) {
    sVar1.internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<duckdb::ClientContext,_true>)
           sVar1.internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (ConnectionException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_40,"Connection has already been closed",&local_41)
  ;
  ConnectionException::ConnectionException(this_00,&local_40);
  __cxa_throw(this_00,&ConnectionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

shared_ptr<ClientContext> ClientContextWrapper::GetContext() {
	auto actual_context = TryGetContext();
	if (!actual_context) {
		throw ConnectionException("Connection has already been closed");
	}
	return actual_context;
}